

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida_ic.c
# Opt level: O0

int IDAICFailFlag(IDAMem IDA_mem,int retval)

{
  undefined4 in_ESI;
  IDAMem in_RDI;
  int local_4;
  
  switch(in_ESI) {
  case 1:
    IDAProcessError(in_RDI,-0xe,0x2c1,"IDAICFailFlag",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/ida/ida_ic.c"
                    ,
                    "The residual routine or the linear setup or solve routine had a recoverable error, but IDACalcIC was unable to recover."
                   );
    local_4 = -0xe;
    break;
  case 2:
    IDAProcessError(in_RDI,-0xb,0x2c6,"IDAICFailFlag",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/ida/ida_ic.c"
                    ,"Unable to satisfy the inequality constraints.");
    local_4 = -0xb;
    break;
  case 3:
    IDAProcessError(in_RDI,-0xd,0x2cb,"IDAICFailFlag",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/ida/ida_ic.c"
                    ,"The linesearch algorithm failed: step too small or too many backtracks.");
    local_4 = -0xd;
    break;
  case 4:
    IDAProcessError(in_RDI,-4,0x2d0,"IDAICFailFlag",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/ida/ida_ic.c"
                    ,"Newton/Linesearch algorithm failed to converge.");
    local_4 = -4;
    break;
  case 5:
    IDAProcessError(in_RDI,-4,0x2d5,"IDAICFailFlag",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/ida/ida_ic.c"
                    ,"Newton/Linesearch algorithm failed to converge.");
    local_4 = -4;
    break;
  case 0xffffffe8:
    IDAProcessError(in_RDI,-0x18,0x2da,"IDAICFailFlag",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/ida/ida_ic.c"
                    ,"Some initial ewt component = 0.0 illegal.");
    local_4 = -0x18;
    break;
  default:
    local_4 = -99;
    break;
  case 0xfffffff4:
    IDAProcessError(in_RDI,-0xc,0x2b2,"IDAICFailFlag",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/ida/ida_ic.c"
                    ,"The residual function failed at the first call. ");
    local_4 = -0xc;
    break;
  case 0xfffffff8:
    IDAProcessError(in_RDI,-8,0x2ad,"IDAICFailFlag",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/ida/ida_ic.c"
                    ,"The residual function failed unrecoverably. ");
    local_4 = -8;
    break;
  case 0xfffffff9:
    IDAProcessError(in_RDI,-7,700,"IDAICFailFlag",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/ida/ida_ic.c"
                    ,"The linear solver solve failed unrecoverably.");
    local_4 = -7;
    break;
  case 0xfffffffa:
    IDAProcessError(in_RDI,-6,0x2b7,"IDAICFailFlag",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/ida/ida_ic.c"
                    ,"The linear solver setup failed unrecoverably.");
    local_4 = -6;
  }
  return local_4;
}

Assistant:

static int IDAICFailFlag(IDAMem IDA_mem, int retval)
{
  /* Depending on retval, print error message and return error flag. */
  switch (retval)
  {
  case IDA_RES_FAIL:
    IDAProcessError(IDA_mem, IDA_RES_FAIL, __LINE__, __func__, __FILE__,
                    MSG_IC_RES_NONREC);
    return (IDA_RES_FAIL);

  case IDA_FIRST_RES_FAIL:
    IDAProcessError(IDA_mem, IDA_FIRST_RES_FAIL, __LINE__, __func__, __FILE__,
                    MSG_IC_RES_FAIL);
    return (IDA_FIRST_RES_FAIL);

  case IDA_LSETUP_FAIL:
    IDAProcessError(IDA_mem, IDA_LSETUP_FAIL, __LINE__, __func__, __FILE__,
                    MSG_IC_SETUP_FAIL);
    return (IDA_LSETUP_FAIL);

  case IDA_LSOLVE_FAIL:
    IDAProcessError(IDA_mem, IDA_LSOLVE_FAIL, __LINE__, __func__, __FILE__,
                    MSG_IC_SOLVE_FAIL);
    return (IDA_LSOLVE_FAIL);

  case IC_FAIL_RECOV:
    IDAProcessError(IDA_mem, IDA_NO_RECOVERY, __LINE__, __func__, __FILE__,
                    MSG_IC_NO_RECOVERY);
    return (IDA_NO_RECOVERY);

  case IC_CONSTR_FAILED:
    IDAProcessError(IDA_mem, IDA_CONSTR_FAIL, __LINE__, __func__, __FILE__,
                    MSG_IC_FAIL_CONSTR);
    return (IDA_CONSTR_FAIL);

  case IC_LINESRCH_FAILED:
    IDAProcessError(IDA_mem, IDA_LINESEARCH_FAIL, __LINE__, __func__, __FILE__,
                    MSG_IC_FAILED_LINS);
    return (IDA_LINESEARCH_FAIL);

  case IC_CONV_FAIL:
    IDAProcessError(IDA_mem, IDA_CONV_FAIL, __LINE__, __func__, __FILE__,
                    MSG_IC_CONV_FAILED);
    return (IDA_CONV_FAIL);

  case IC_SLOW_CONVRG:
    IDAProcessError(IDA_mem, IDA_CONV_FAIL, __LINE__, __func__, __FILE__,
                    MSG_IC_CONV_FAILED);
    return (IDA_CONV_FAIL);

  case IDA_BAD_EWT:
    IDAProcessError(IDA_mem, IDA_BAD_EWT, __LINE__, __func__, __FILE__,
                    MSG_IC_BAD_EWT);
    return (IDA_BAD_EWT);
  }
  return -99;
}